

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleCustom.cpp
# Opt level: O1

string * __thiscall
MyCustomTypeHandler::toString_abi_cxx11_
          (string *__return_storage_ptr__,MyCustomTypeHandler *this,Slice *value,Options *param_2,
          Slice *param_3)

{
  byte bVar1;
  uint8_t *puVar2;
  pointer pcVar3;
  undefined8 *puVar4;
  string *__str;
  
  puVar2 = value->_start;
  if (*puVar2 == 0xf4) {
    bVar1 = puVar2[1];
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,puVar2,puVar2 + bVar1);
  }
  else {
    if (*puVar2 != 0xf0) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar4 = "unknown type!";
      __cxa_throw(puVar4,&char_const*::typeinfo,0);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (__return_storage_ptr__,2,'-');
    pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
    pcVar3[0] = '4';
    pcVar3[1] = '2';
  }
  return __return_storage_ptr__;
}

Assistant:

std::string toString(Slice const& value, Options const*, Slice const&) final {
    if (value.head() == 0xf0) {
      return std::to_string(myMagicNumber);
    }
    if (value.head() == 0xf4) {
      char const* start = value.startAs<char const>();
      // read string length
      uint8_t length = *(value.start() + 1);
      // append string (don't care about escaping here...)
      return std::string(start, length);
    }
    throw "unknown type!";
  }